

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicKey.cpp
# Opt level: O0

int jbcoin::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  reference_const_type pKVar3;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  uint8_t *m;
  size_t mlen;
  uint8_t *puVar4;
  uint8_t *RS;
  result_type local_5c;
  type local_3c;
  optional<jbcoin::KeyType> type;
  bool mustBeFullyCanonical_local;
  Slice *sig_local;
  Slice *m_local;
  PublicKey *publicKey_local;
  
  type.super_type._3_1_ = (byte)tbs & 1;
  unique0x1000014e = (Slice *)siglen;
  local_3c = (type)publicKeyType((PublicKey *)ctx);
  bVar1 = boost::optional<jbcoin::KeyType>::operator!((optional<jbcoin::KeyType> *)&local_3c);
  pKVar3 = (reference_const_type)(CONCAT71(extraout_var,bVar1) ^ 0xff);
  if (((ulong)pKVar3 & 1) != 0) {
    pKVar3 = boost::optional<jbcoin::KeyType>::operator*((optional<jbcoin::KeyType> *)&local_3c);
    if (*pKVar3 == secp256k1) {
      sha512Half<jbcoin::Slice>(&local_5c,(Slice *)sig);
      publicKey_local._7_1_ =
           verifyDigest((PublicKey *)ctx,&local_5c,stack0xffffffffffffffd0,
                        (bool)(type.super_type._3_1_ & 1));
      pKVar3 = (reference_const_type)CONCAT71(extraout_var_00,publicKey_local._7_1_);
      goto LAB_002eb2c8;
    }
    pKVar3 = boost::optional<jbcoin::KeyType>::operator*((optional<jbcoin::KeyType> *)&local_3c);
    if (*pKVar3 == ed25519) {
      bVar1 = ed25519Canonical(stack0xffffffffffffffd0);
      pKVar3 = (reference_const_type)CONCAT71(extraout_var_01,bVar1);
      if (bVar1) {
        m = Slice::data((Slice *)sig);
        mlen = Slice::size((Slice *)sig);
        puVar4 = PublicKey::data((PublicKey *)ctx);
        RS = Slice::data(stack0xffffffffffffffd0);
        iVar2 = ed25519_sign_open(m,mlen,puVar4 + 1,RS);
        publicKey_local._7_1_ = iVar2 == 0;
        pKVar3 = (reference_const_type)
                 (ulong)CONCAT31((int3)((uint)iVar2 >> 8),publicKey_local._7_1_);
      }
      else {
        publicKey_local._7_1_ = false;
      }
      goto LAB_002eb2c8;
    }
  }
  publicKey_local._7_1_ = false;
LAB_002eb2c8:
  return (int)CONCAT71((int7)((ulong)pKVar3 >> 8),publicKey_local._7_1_);
}

Assistant:

bool
verify (PublicKey const& publicKey,
    Slice const& m,
    Slice const& sig,
    bool mustBeFullyCanonical)
{
    if (auto const type = publicKeyType(publicKey))
    {
        if (*type == KeyType::secp256k1)
        {
            return verifyDigest (publicKey,
                sha512Half(m), sig, mustBeFullyCanonical);
        }
        else if (*type == KeyType::ed25519)
        {
            if (! ed25519Canonical(sig))
                return false;

            // We internally prefix Ed25519 keys with a 0xED
            // byte to distinguish them from secp256k1 keys
            // so when verifying the signature, we need to
            // first strip that prefix.
            return ed25519_sign_open(
                m.data(), m.size(), publicKey.data() + 1,
                    sig.data()) == 0;
        }
    }
    return false;
}